

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

int nn_connect(int s,char *addr)

{
  int iVar1;
  int *piVar2;
  nn_sock *sock;
  
  nn_glock_lock();
  iVar1 = nn_global_hold_socket_locked(&sock,s);
  nn_glock_unlock();
  if (-1 < iVar1) {
    iVar1 = nn_global_create_ep(sock,addr,0);
    nn_glock_lock();
    nn_sock_rele(sock);
    nn_glock_unlock();
    if (-1 < iVar1) {
      return iVar1;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = -iVar1;
  return -1;
}

Assistant:

int nn_connect (int s, const char *addr)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        goto failure;
    }

    rc = nn_global_create_ep (sock, addr, 0);
    if (rc < 0) {
        nn_global_rele_socket (sock);
        goto failure;
    }

    nn_global_rele_socket (sock);
    return rc;

failure:
    errno = -rc;
    return -1;
}